

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cstring.cpp
# Opt level: O2

char uprv_ebcdictolower_63(char c)

{
  char cVar1;
  char cVar2;
  
  cVar2 = c;
  if ((byte)((c & 0xefU) + 0x3f) < 9) {
    cVar2 = c + -0x40;
  }
  cVar1 = c + -0x40;
  if (7 < (byte)(c + 0x1eU)) {
    cVar1 = cVar2;
  }
  return cVar1;
}

Assistant:

U_CAPI char U_EXPORT2
uprv_ebcdictolower(char c) {
    if( (0xc1<=(uint8_t)c && (uint8_t)c<=0xc9) ||
        (0xd1<=(uint8_t)c && (uint8_t)c<=0xd9) ||
        (0xe2<=(uint8_t)c && (uint8_t)c<=0xe9)
    ) {
        c=(char)(c-0x40);
    }
    return c;
}